

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::Extension::SerializeFieldWithCachedSizes
          (Extension *this,int number,CodedOutputStream *output)

{
  int iVar1;
  CodedOutputStream *pCVar2;
  uint32 uVar3;
  FieldType FVar4;
  int iVar5;
  uint *puVar6;
  int *piVar7;
  long *plVar8;
  uint64 uVar9;
  unsigned_long *puVar10;
  uint32 *puVar11;
  uint64 *puVar12;
  float *pfVar13;
  double *pdVar14;
  bool *pbVar15;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  MessageLite *pMVar17;
  int local_1d8;
  int local_1d4;
  int i_31;
  int i_30;
  int i_29;
  int i_28;
  int i_27;
  int i_26;
  int i_25;
  int i_24;
  int i_23;
  int i_22;
  int i_21;
  int i_20;
  int i_19;
  int i_18;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  LogMessage local_180;
  int local_148;
  int local_144;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  CodedOutputStream *output_local;
  Extension *pEStack_100;
  int number_local;
  Extension *this_local;
  undefined4 local_f0;
  int local_ec;
  CodedOutputStream *local_e8;
  int32 local_dc;
  CodedOutputStream *local_d8;
  uint64 local_d0;
  CodedOutputStream *local_c8;
  uint32 local_bc;
  CodedOutputStream *local_b8;
  uint64 local_b0;
  CodedOutputStream *local_a8;
  int32 local_9c;
  CodedOutputStream *local_98;
  int64 local_90;
  CodedOutputStream *local_88;
  uint32 local_7c;
  CodedOutputStream *local_78;
  uint64 local_70;
  CodedOutputStream *local_68;
  uint32 local_5c;
  CodedOutputStream *local_58;
  uint64 local_50;
  CodedOutputStream *local_48;
  float local_3c;
  CodedOutputStream *local_38;
  double local_30;
  CodedOutputStream *local_28;
  byte local_19;
  CodedOutputStream *local_18;
  int32 local_c;
  
  _i_1 = output;
  output_local._4_4_ = number;
  pEStack_100 = this;
  if ((this->is_repeated & 1U) == 0) {
    if ((this->field_0xa & 1) == 0) {
      FVar4 = anon_unknown_0::real_type(this->type);
      switch(FVar4) {
      case TYPE_DOUBLE:
        WireFormatLite::WriteDouble(output_local._4_4_,(this->field_0).double_value,_i_1);
        break;
      case TYPE_FLOAT:
        WireFormatLite::WriteFloat(output_local._4_4_,(this->field_0).float_value,_i_1);
        break;
      case TYPE_INT64:
        WireFormatLite::WriteInt64(output_local._4_4_,(this->field_0).int64_value,_i_1);
        break;
      case TYPE_UINT64:
        WireFormatLite::WriteUInt64(output_local._4_4_,(this->field_0).uint64_value,_i_1);
        break;
      case TYPE_INT32:
        WireFormatLite::WriteInt32(output_local._4_4_,(this->field_0).int32_value,_i_1);
        break;
      case TYPE_FIXED64:
        WireFormatLite::WriteFixed64(output_local._4_4_,(this->field_0).uint64_value,_i_1);
        break;
      case TYPE_FIXED32:
        WireFormatLite::WriteFixed32(output_local._4_4_,(this->field_0).uint32_value,_i_1);
        break;
      case TYPE_BOOL:
        WireFormatLite::WriteBool(output_local._4_4_,(bool)((this->field_0).bool_value & 1),_i_1);
        break;
      case TYPE_STRING:
        WireFormatLite::WriteString(output_local._4_4_,(this->field_0).string_value,_i_1);
        break;
      case TYPE_GROUP:
        WireFormatLite::WriteGroup(output_local._4_4_,(this->field_0).message_value,_i_1);
        break;
      case TYPE_MESSAGE:
        if (((byte)this->field_0xa >> 4 & 1) == 0) {
          WireFormatLite::WriteMessage(output_local._4_4_,(this->field_0).message_value,_i_1);
        }
        else {
          (**(code **)(((this->field_0).repeated_int32_value)->elements_ + 0x1a))
                    ((this->field_0).repeated_int32_value,output_local._4_4_,_i_1);
        }
        break;
      case TYPE_BYTES:
        WireFormatLite::WriteBytes(output_local._4_4_,(this->field_0).string_value,_i_1);
        break;
      case TYPE_UINT32:
        WireFormatLite::WriteUInt32(output_local._4_4_,(this->field_0).uint32_value,_i_1);
        break;
      case TYPE_ENUM:
        WireFormatLite::WriteEnum(output_local._4_4_,(this->field_0).enum_value,_i_1);
        break;
      case TYPE_SFIXED32:
        WireFormatLite::WriteSFixed32(output_local._4_4_,(this->field_0).int32_value,_i_1);
        break;
      case TYPE_SFIXED64:
        WireFormatLite::WriteSFixed64(output_local._4_4_,(this->field_0).int64_value,_i_1);
        break;
      case TYPE_SINT32:
        WireFormatLite::WriteSInt32(output_local._4_4_,(this->field_0).int32_value,_i_1);
        break;
      case MAX_FIELD_TYPE:
        WireFormatLite::WriteSInt64(output_local._4_4_,(this->field_0).int64_value,_i_1);
      }
    }
  }
  else if ((this->is_packed & 1U) == 0) {
    FVar4 = anon_unknown_0::real_type(this->type);
    switch(FVar4) {
    case TYPE_DOUBLE:
      for (i_27 = 0; iVar5 = RepeatedField<double>::size((this->field_0).repeated_double_value),
          iVar1 = output_local._4_4_, i_27 < iVar5; i_27 = i_27 + 1) {
        pdVar14 = RepeatedField<double>::Get((this->field_0).repeated_double_value,i_27);
        WireFormatLite::WriteDouble(iVar1,*pdVar14,_i_1);
      }
      break;
    case TYPE_FLOAT:
      for (i_26 = 0; iVar5 = RepeatedField<float>::size((this->field_0).repeated_float_value),
          iVar1 = output_local._4_4_, i_26 < iVar5; i_26 = i_26 + 1) {
        pfVar13 = RepeatedField<float>::Get((this->field_0).repeated_float_value,i_26);
        WireFormatLite::WriteFloat(iVar1,*pfVar13,_i_1);
      }
      break;
    case TYPE_INT64:
      for (i_17 = 0; iVar5 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          iVar1 = output_local._4_4_, i_17 < iVar5; i_17 = i_17 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_17);
        WireFormatLite::WriteInt64(iVar1,*plVar8,_i_1);
      }
      break;
    case TYPE_UINT64:
      for (i_19 = 0;
          iVar5 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 = output_local._4_4_, i_19 < iVar5; i_19 = i_19 + 1) {
        puVar10 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_19);
        WireFormatLite::WriteUInt64(iVar1,*puVar10,_i_1);
      }
      break;
    case TYPE_INT32:
      for (i_16 = 0; iVar5 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = output_local._4_4_, i_16 < iVar5; i_16 = i_16 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_16);
        WireFormatLite::WriteInt32(iVar1,*piVar7,_i_1);
      }
      break;
    case TYPE_FIXED64:
      for (i_23 = 0;
          iVar5 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 = output_local._4_4_, i_23 < iVar5; i_23 = i_23 + 1) {
        puVar10 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_23);
        WireFormatLite::WriteFixed64(iVar1,*puVar10,_i_1);
      }
      break;
    case TYPE_FIXED32:
      for (i_22 = 0;
          iVar5 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 = output_local._4_4_, i_22 < iVar5; i_22 = i_22 + 1) {
        puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_22);
        WireFormatLite::WriteFixed32(iVar1,*puVar6,_i_1);
      }
      break;
    case TYPE_BOOL:
      for (i_28 = 0; iVar5 = RepeatedField<bool>::size((this->field_0).repeated_bool_value),
          iVar1 = output_local._4_4_, i_28 < iVar5; i_28 = i_28 + 1) {
        pbVar15 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,i_28);
        WireFormatLite::WriteBool(iVar1,(bool)(*pbVar15 & 1),_i_1);
      }
      break;
    case TYPE_STRING:
      for (i_29 = 0;
          iVar5 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), iVar1 = output_local._4_4_,
          i_29 < iVar5; i_29 = i_29 + 1) {
        pbVar16 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((this->field_0).repeated_string_value,i_29);
        WireFormatLite::WriteString(iVar1,pbVar16,_i_1);
      }
      break;
    case TYPE_GROUP:
      for (local_1d4 = 0;
          iVar5 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), iVar1 = output_local._4_4_,
          local_1d4 < iVar5; local_1d4 = local_1d4 + 1) {
        pMVar17 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,local_1d4);
        WireFormatLite::WriteGroup(iVar1,pMVar17,_i_1);
      }
      break;
    case TYPE_MESSAGE:
      for (local_1d8 = 0;
          iVar5 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), iVar1 = output_local._4_4_,
          local_1d8 < iVar5; local_1d8 = local_1d8 + 1) {
        pMVar17 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,local_1d8);
        WireFormatLite::WriteMessage(iVar1,pMVar17,_i_1);
      }
      break;
    case TYPE_BYTES:
      for (i_30 = 0;
          iVar5 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), iVar1 = output_local._4_4_,
          i_30 < iVar5; i_30 = i_30 + 1) {
        pbVar16 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((this->field_0).repeated_string_value,i_30);
        WireFormatLite::WriteBytes(iVar1,pbVar16,_i_1);
      }
      break;
    case TYPE_UINT32:
      for (i_18 = 0;
          iVar5 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 = output_local._4_4_, i_18 < iVar5; i_18 = i_18 + 1) {
        puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_18);
        WireFormatLite::WriteUInt32(iVar1,*puVar6,_i_1);
      }
      break;
    case TYPE_ENUM:
      for (i_31 = 0; iVar5 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = output_local._4_4_, i_31 < iVar5; i_31 = i_31 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_31);
        WireFormatLite::WriteEnum(iVar1,*piVar7,_i_1);
      }
      break;
    case TYPE_SFIXED32:
      for (i_24 = 0; iVar5 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = output_local._4_4_, i_24 < iVar5; i_24 = i_24 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_24);
        WireFormatLite::WriteSFixed32(iVar1,*piVar7,_i_1);
      }
      break;
    case TYPE_SFIXED64:
      for (i_25 = 0; iVar5 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          iVar1 = output_local._4_4_, i_25 < iVar5; i_25 = i_25 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_25);
        WireFormatLite::WriteSFixed64(iVar1,*plVar8,_i_1);
      }
      break;
    case TYPE_SINT32:
      for (i_20 = 0; iVar5 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = output_local._4_4_, i_20 < iVar5; i_20 = i_20 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_20);
        WireFormatLite::WriteSInt32(iVar1,*piVar7,_i_1);
      }
      break;
    case MAX_FIELD_TYPE:
      for (i_21 = 0; iVar5 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          iVar1 = output_local._4_4_, i_21 < iVar5; i_21 = i_21 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_21);
        WireFormatLite::WriteSInt64(iVar1,*plVar8,_i_1);
      }
    }
  }
  else if (this->cached_size != 0) {
    local_f0 = 2;
    this_local = (Extension *)output;
    local_ec = number;
    uVar3 = WireFormatLite::MakeTag(number,WIRETYPE_LENGTH_DELIMITED);
    io::CodedOutputStream::WriteTag(output,uVar3);
    io::CodedOutputStream::WriteVarint32(_i_1,this->cached_size);
    FVar4 = anon_unknown_0::real_type(this->type);
    switch(FVar4) {
    case TYPE_DOUBLE:
      for (i_13 = 0; iVar1 = i_13,
          iVar5 = RepeatedField<double>::size((this->field_0).repeated_double_value), iVar1 < iVar5;
          i_13 = i_13 + 1) {
        pdVar14 = RepeatedField<double>::Get((this->field_0).repeated_double_value,i_13);
        pCVar2 = _i_1;
        local_30 = *pdVar14;
        local_38 = _i_1;
        uVar9 = WireFormatLite::EncodeDouble(local_30);
        io::CodedOutputStream::WriteLittleEndian64(pCVar2,uVar9);
      }
      break;
    case TYPE_FLOAT:
      for (i_12 = 0; iVar1 = i_12,
          iVar5 = RepeatedField<float>::size((this->field_0).repeated_float_value), iVar1 < iVar5;
          i_12 = i_12 + 1) {
        pfVar13 = RepeatedField<float>::Get((this->field_0).repeated_float_value,i_12);
        pCVar2 = _i_1;
        local_3c = *pfVar13;
        local_48 = _i_1;
        uVar3 = WireFormatLite::EncodeFloat(local_3c);
        io::CodedOutputStream::WriteLittleEndian32(pCVar2,uVar3);
      }
      break;
    case TYPE_INT64:
      for (i_3 = 0; iVar1 = i_3,
          iVar5 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar1 < iVar5;
          i_3 = i_3 + 1) {
        puVar12 = (uint64 *)RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_3);
        local_d0 = *puVar12;
        local_d8 = _i_1;
        io::CodedOutputStream::WriteVarint64(_i_1,local_d0);
      }
      break;
    case TYPE_UINT64:
      for (i_5 = 0; iVar1 = i_5,
          iVar5 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 < iVar5; i_5 = i_5 + 1) {
        puVar10 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_5);
        local_b0 = *puVar10;
        local_b8 = _i_1;
        io::CodedOutputStream::WriteVarint64(_i_1,local_b0);
      }
      break;
    case TYPE_INT32:
      for (i_2 = 0; iVar1 = i_2,
          iVar5 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar5;
          i_2 = i_2 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_2);
        local_dc = *piVar7;
        local_e8 = _i_1;
        io::CodedOutputStream::WriteVarint32SignExtended(_i_1,local_dc);
      }
      break;
    case TYPE_FIXED64:
      for (i_9 = 0; iVar1 = i_9,
          iVar5 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 < iVar5; i_9 = i_9 + 1) {
        puVar10 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_9);
        local_70 = *puVar10;
        local_78 = _i_1;
        io::CodedOutputStream::WriteLittleEndian64(_i_1,local_70);
      }
      break;
    case TYPE_FIXED32:
      for (i_8 = 0; iVar1 = i_8,
          iVar5 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 < iVar5; i_8 = i_8 + 1) {
        puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_8);
        local_7c = *puVar6;
        local_88 = _i_1;
        io::CodedOutputStream::WriteLittleEndian32(_i_1,local_7c);
      }
      break;
    case TYPE_BOOL:
      for (local_144 = 0; iVar1 = local_144,
          iVar5 = RepeatedField<bool>::size((this->field_0).repeated_bool_value), iVar1 < iVar5;
          local_144 = local_144 + 1) {
        pbVar15 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,local_144);
        local_19 = *pbVar15 & 1;
        local_28 = _i_1;
        io::CodedOutputStream::WriteVarint32(_i_1,(uint)(local_19 != 0));
      }
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (&local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x49d);
      other = LogMessage::operator<<(&local_180,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=((LogFinisher *)((long)&i_15 + 3),other);
      LogMessage::~LogMessage(&local_180);
      break;
    case TYPE_UINT32:
      for (i_4 = 0; iVar1 = i_4,
          iVar5 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 < iVar5; i_4 = i_4 + 1) {
        puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_4);
        local_bc = *puVar6;
        local_c8 = _i_1;
        io::CodedOutputStream::WriteVarint32(_i_1,local_bc);
      }
      break;
    case TYPE_ENUM:
      for (local_148 = 0; iVar1 = local_148,
          iVar5 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar5;
          local_148 = local_148 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,local_148);
        local_c = *piVar7;
        local_18 = _i_1;
        io::CodedOutputStream::WriteVarint32SignExtended(_i_1,local_c);
      }
      break;
    case TYPE_SFIXED32:
      for (i_10 = 0; iVar1 = i_10,
          iVar5 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar5;
          i_10 = i_10 + 1) {
        puVar11 = (uint32 *)RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_10);
        local_5c = *puVar11;
        local_68 = _i_1;
        io::CodedOutputStream::WriteLittleEndian32(_i_1,local_5c);
      }
      break;
    case TYPE_SFIXED64:
      for (i_11 = 0; iVar1 = i_11,
          iVar5 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar1 < iVar5;
          i_11 = i_11 + 1) {
        puVar12 = (uint64 *)RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_11);
        local_50 = *puVar12;
        local_58 = _i_1;
        io::CodedOutputStream::WriteLittleEndian64(_i_1,local_50);
      }
      break;
    case TYPE_SINT32:
      for (i_6 = 0; iVar1 = i_6,
          iVar5 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar5;
          i_6 = i_6 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_6);
        pCVar2 = _i_1;
        local_9c = *piVar7;
        local_a8 = _i_1;
        uVar3 = WireFormatLite::ZigZagEncode32(local_9c);
        io::CodedOutputStream::WriteVarint32(pCVar2,uVar3);
      }
      break;
    case MAX_FIELD_TYPE:
      for (i_7 = 0; iVar1 = i_7,
          iVar5 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar1 < iVar5;
          i_7 = i_7 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_7);
        pCVar2 = _i_1;
        local_90 = *plVar8;
        local_98 = _i_1;
        uVar9 = WireFormatLite::ZigZagEncode64(local_90);
        io::CodedOutputStream::WriteVarint64(pCVar2,uVar9);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::SerializeFieldWithCachedSizes(
    int number,
    io::CodedOutputStream* output) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size == 0) return;

      WireFormatLite::WriteTag(number,
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
      output->WriteVarint32(cached_size);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE##NoTag(                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE(number,                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                 \
      case WireFormatLite::TYPE_##UPPERCASE:                     \
        WireFormatLite::Write##CAMELCASE(number, VALUE, output); \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE( FIXED32,  Fixed32,   uint32_value);
      HANDLE_TYPE( FIXED64,  Fixed64,   uint64_value);
      HANDLE_TYPE(SFIXED32, SFixed32,    int32_value);
      HANDLE_TYPE(SFIXED64, SFixed64,    int64_value);
      HANDLE_TYPE(   FLOAT,    Float,    float_value);
      HANDLE_TYPE(  DOUBLE,   Double,   double_value);
      HANDLE_TYPE(    BOOL,     Bool,     bool_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          lazymessage_value->WriteMessage(number, output);
        } else {
          WireFormatLite::WriteMessage(number, *message_value, output);
        }
        break;
    }
  }
}